

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O3

short duckdb::SubtractOperatorOverflowCheck::Operation<short,short,short>(short left,short right)

{
  short sVar1;
  int iVar2;
  OutOfRangeException *this;
  PhysicalType type;
  undefined6 in_register_00000032;
  undefined6 in_register_0000003a;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,left) - (int)CONCAT62(in_register_00000032,right);
  sVar1 = (short)iVar2;
  if (sVar1 == iVar2) {
    return sVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"Overflow in subtraction of %s (%s - %s)!","");
  TypeIdToString_abi_cxx11_(&local_40,(duckdb *)&DAT_00000005,type);
  NumericHelper::ToString<short>(&local_60,left);
  NumericHelper::ToString<short>(&local_80,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_a0,&local_40,&local_60,&local_80);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		return left - right;
	}